

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O1

vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> * __thiscall
cmGeneratorExpressionLexer::Tokenize
          (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           *__return_storage_ptr__,cmGeneratorExpressionLexer *this,string *input)

{
  pointer *ppcVar1;
  byte bVar2;
  iterator iVar3;
  byte *upto;
  byte *c;
  cmGeneratorExpressionToken local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  upto = (byte *)(input->_M_dataplus)._M_p;
  c = upto;
  do {
    bVar2 = *c;
    if (bVar2 < 0x3a) {
      if (bVar2 == 0x24) {
        if (c[1] == 0x3c) {
          InsertText((char *)upto,(char *)c,__return_storage_ptr__);
          local_38.TokenType = 1;
          local_38.Length = 2;
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_38.Content = (char *)c;
            std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
            _M_realloc_insert<cmGeneratorExpressionToken>(__return_storage_ptr__,iVar3,&local_38);
          }
          else {
            (iVar3._M_current)->Length = 2;
            *(ulong *)iVar3._M_current = CONCAT44(local_38._4_4_,1);
            (iVar3._M_current)->Content = (char *)c;
            ppcVar1 = &(__return_storage_ptr__->
                       super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
            local_38.Content = (char *)c;
          }
          upto = c + 2;
          this->SawBeginExpression = true;
          c = c + 1;
        }
      }
      else {
        if (bVar2 == 0x2c) {
          InsertText((char *)upto,(char *)c,__return_storage_ptr__);
          local_38.TokenType = 4;
          local_38.Length = 1;
          iVar3._M_current =
               (__return_storage_ptr__->
               super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current !=
              (__return_storage_ptr__->
              super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_003fd28b;
          local_38.Content = (char *)c;
          std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
          _M_realloc_insert<cmGeneratorExpressionToken>(__return_storage_ptr__,iVar3,&local_38);
          goto LAB_003fd2b3;
        }
        if (bVar2 == 0) {
          InsertText((char *)upto,(char *)c,__return_storage_ptr__);
          return __return_storage_ptr__;
        }
      }
    }
    else if (bVar2 == 0x3a) {
      InsertText((char *)upto,(char *)c,__return_storage_ptr__);
      local_38.TokenType = 3;
      local_38.Length = 1;
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38.Content = (char *)c;
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        _M_realloc_insert<cmGeneratorExpressionToken>(__return_storage_ptr__,iVar3,&local_38);
      }
      else {
LAB_003fd28b:
        local_38.Length = 1;
        (iVar3._M_current)->Length = 1;
        *(ulong *)iVar3._M_current = CONCAT44(local_38._4_4_,local_38.TokenType);
        (iVar3._M_current)->Content = (char *)c;
        ppcVar1 = &(__return_storage_ptr__->
                   super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
        local_38.Content = (char *)c;
      }
LAB_003fd2b3:
      upto = c + 1;
    }
    else if (bVar2 == 0x3e) {
      InsertText((char *)upto,(char *)c,__return_storage_ptr__);
      local_38.TokenType = 2;
      local_38.Length = 1;
      iVar3._M_current =
           (__return_storage_ptr__->
           super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_38.Content = (char *)c;
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        _M_realloc_insert<cmGeneratorExpressionToken>(__return_storage_ptr__,iVar3,&local_38);
      }
      else {
        (iVar3._M_current)->Length = 1;
        *(ulong *)iVar3._M_current = CONCAT44(local_38._4_4_,2);
        (iVar3._M_current)->Content = (char *)c;
        ppcVar1 = &(__return_storage_ptr__->
                   super__Vector_base<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppcVar1 = *ppcVar1 + 1;
        local_38.Content = (char *)c;
      }
      upto = c + 1;
      this->SawGeneratorExpression = this->SawBeginExpression;
    }
    c = c + 1;
  } while( true );
}

Assistant:

std::vector<cmGeneratorExpressionToken>
cmGeneratorExpressionLexer::Tokenize(const std::string& input)
{
  std::vector<cmGeneratorExpressionToken> result;

  const char *c = input.c_str();
  const char *upto = c;

  for ( ; *c; ++c)
    {
    switch(*c)
      {
      case '$':
        if(c[1] == '<')
          {
          InsertText(upto, c, result);
          result.push_back(cmGeneratorExpressionToken(
                           cmGeneratorExpressionToken::BeginExpression, c, 2));
          upto = c + 2;
          ++c;
          SawBeginExpression = true;
          }
        break;
      case '>':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::EndExpression, c, 1));
        upto = c + 1;
        SawGeneratorExpression = SawBeginExpression;
        break;
      case ':':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::ColonSeparator, c, 1));
        upto = c + 1;
        break;
      case ',':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::CommaSeparator, c, 1));
        upto = c + 1;
        break;
      default:
        break;
      }
  }
  InsertText(upto, c, result);

  return result;
}